

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

SearchStatus __thiscall tsbp::LeftmostActiveOnly::SolveParallelNative(LeftmostActiveOnly *this)

{
  _Storage<int,_true> _Var1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  double dVar5;
  LeftmostActiveOnly *pLVar6;
  SearchStatus SVar7;
  uint uVar8;
  tuple<tsbp::LeftmostActiveOnly_*,_std::default_delete<tsbp::LeftmostActiveOnly>_> this_00;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  ulong uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long lVar13;
  ulong __val;
  _Storage<int,_true> *p_Var14;
  char *pcVar15;
  uint __len;
  atomic<bool> isFeasible;
  atomic<bool> feasibleSolutionCancellationToken;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  begin;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  endLast;
  atomic<long> exploredNodes;
  string __str;
  vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  subtrees;
  atomic<unsigned_long> exploredSubtrees;
  Packing2D solution;
  mutex mutex;
  byte local_1f6;
  atomic<bool> local_1f5;
  SearchStatus local_1f4;
  undefined8 local_1f0;
  LeftmostActiveOnly *local_1e8;
  undefined8 local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  vector<int,_std::allocator<int>_> *local_1b8;
  vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *local_1b0;
  _Storage<int,_true> *local_1a8;
  ulong local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  local_178;
  _Storage<int,_true> local_160;
  bool bStack_15c;
  undefined3 uStack_15b;
  pointer puStack_158;
  SearchStatus *local_150;
  undefined8 *puStack_148;
  LeftmostActiveOnly **local_140;
  byte *local_138;
  ulong *local_130;
  undefined8 *local_128;
  LeftmostActiveOnly *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 local_100;
  Packing2D local_f8;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_1f0 = std::chrono::_V2::steady_clock::now();
  local_1f5._M_base._M_i = (__atomic_base<bool>)false;
  local_178.
  super__Vector_base<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0 = local_1f0;
  std::
  vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  ::reserve(&local_178,
            (long)(this->items).
                  super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->items).
                  super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                  super__Vector_impl_data._M_start >> 5);
  p_Var14 = (_Storage<int,_true> *)
            (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1a8 = (_Storage<int,_true> *)
              (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_1e8 = this;
  if (p_Var14 != local_1a8) {
    local_1b0 = &this->items;
    local_1b8 = &this->branchingOrder;
    do {
      _Var1 = (_Storage<int,_true>)p_Var14->_M_value;
      this_00.
      super__Tuple_impl<0UL,_tsbp::LeftmostActiveOnly_*,_std::default_delete<tsbp::LeftmostActiveOnly>_>
      .super__Head_base<0UL,_tsbp::LeftmostActiveOnly_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_tsbp::LeftmostActiveOnly_*,_std::default_delete<tsbp::LeftmostActiveOnly>_>
            )operator_new(0x2c8);
      LeftmostActiveOnly((LeftmostActiveOnly *)
                         this_00.
                         super__Tuple_impl<0UL,_tsbp::LeftmostActiveOnly_*,_std::default_delete<tsbp::LeftmostActiveOnly>_>
                         .super__Head_base<0UL,_tsbp::LeftmostActiveOnly_*,_false>._M_head_impl,
                         &this->parameters);
      uVar3 = *(undefined8 *)&(this->container).super_Rectangle;
      uVar4 = *(undefined8 *)&(this->container).super_Rectangle.Dx;
      dVar5 = (this->container).super_Rectangle.Area;
      *(undefined8 *)
       &((Bin *)((long)this_00.
                       super__Tuple_impl<0UL,_tsbp::LeftmostActiveOnly_*,_std::default_delete<tsbp::LeftmostActiveOnly>_>
                       .super__Head_base<0UL,_tsbp::LeftmostActiveOnly_*,_false>._M_head_impl + 0xd8
                ))->super_Rectangle = *(undefined8 *)&(this->container).super_Rectangle.InternId;
      *(double *)
       &((Bin *)((long)this_00.
                       super__Tuple_impl<0UL,_tsbp::LeftmostActiveOnly_*,_std::default_delete<tsbp::LeftmostActiveOnly>_>
                       .super__Head_base<0UL,_tsbp::LeftmostActiveOnly_*,_false>._M_head_impl + 0xe0
                ))->super_Rectangle = dVar5;
      *(undefined8 *)
       &((Bin *)((long)this_00.
                       super__Tuple_impl<0UL,_tsbp::LeftmostActiveOnly_*,_std::default_delete<tsbp::LeftmostActiveOnly>_>
                       .super__Head_base<0UL,_tsbp::LeftmostActiveOnly_*,_false>._M_head_impl + 200)
        )->super_Rectangle = uVar3;
      *(undefined8 *)
       &((Bin *)((long)this_00.
                       super__Tuple_impl<0UL,_tsbp::LeftmostActiveOnly_*,_std::default_delete<tsbp::LeftmostActiveOnly>_>
                       .super__Head_base<0UL,_tsbp::LeftmostActiveOnly_*,_false>._M_head_impl + 0xd0
                ))->super_Rectangle = uVar4;
      bStack_15c = true;
      local_160 = (_Storage<int,_true>)(_Storage<int,_true>)_Var1._M_value;
      local_f8._0_8_ =
           this_00.
           super__Tuple_impl<0UL,_tsbp::LeftmostActiveOnly_*,_std::default_delete<tsbp::LeftmostActiveOnly>_>
           .super__Head_base<0UL,_tsbp::LeftmostActiveOnly_*,_false>._M_head_impl;
      AddItems((LeftmostActiveOnly *)
               this_00.
               super__Tuple_impl<0UL,_tsbp::LeftmostActiveOnly_*,_std::default_delete<tsbp::LeftmostActiveOnly>_>
               .super__Head_base<0UL,_tsbp::LeftmostActiveOnly_*,_false>._M_head_impl,local_1b0,
               (optional<int> *)&local_160,&this->fixedItemCoordinatesX);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)(local_f8._0_8_ + 0x68),local_1b8);
      *(atomic<bool> **)(local_f8._0_8_ + 0x80) = &local_1f5;
      std::
      vector<std::unique_ptr<tsbp::LeftmostActiveOnly,std::default_delete<tsbp::LeftmostActiveOnly>>,std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,std::default_delete<tsbp::LeftmostActiveOnly>>>>
      ::
      emplace_back<std::unique_ptr<tsbp::LeftmostActiveOnly,std::default_delete<tsbp::LeftmostActiveOnly>>>
                ((vector<std::unique_ptr<tsbp::LeftmostActiveOnly,std::default_delete<tsbp::LeftmostActiveOnly>>,std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,std::default_delete<tsbp::LeftmostActiveOnly>>>>
                  *)&local_178,
                 (unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>
                  *)&local_f8);
      if ((LeftmostActiveOnly *)local_f8._0_8_ != (LeftmostActiveOnly *)0x0) {
        (*((IBranchAndBoundSolver *)local_f8._0_8_)->_vptr_IBranchAndBoundSolver[1])();
      }
      p_Var14 = p_Var14 + 1;
    } while (p_Var14 != local_1a8);
  }
  local_1f4 = None;
  local_100 = 0;
  local_1a0 = 0;
  local_1f6 = 0;
  memset(&local_f8,0,0x88);
  pLVar6 = local_1e8;
  local_f8.ReducedItemInfeasiblePlacementPoints._0_2_ = 0xffff;
  local_f8.ReducedItemInfeasiblePlacementPoints._2_6_ = 0xffffffffffff;
  local_f8.IsReducedItemPlaced = false;
  local_f8.IsFixedItemPlaced = false;
  puStack_148 = &local_58;
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_1d8._M_string_length = (size_type)&local_160;
  _local_160 = (_Optional_payload_base<int>)
               local_178.
               super__Vector_base<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  puStack_158 = local_178.
                super__Vector_base<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_120 = local_1e8;
  local_118 = &local_1e0;
  local_110 = &local_1f0;
  local_1d8._M_dataplus._M_p = (pointer)&PTR_operator___0017c8c8;
  local_150 = &local_1f4;
  local_140 = (LeftmostActiveOnly **)&local_f8;
  local_138 = &local_1f6;
  local_130 = &local_1a0;
  local_128 = &local_100;
  tbb::detail::r1::isolate_within_arena((delegate_base *)&local_1d8,0);
  if (local_1f4 == Abort) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Search was aborted.\n",0x14);
  }
  else {
    if ((local_1f6 & 1) == 0) {
      lVar13 = 0x17;
      pcVar15 = "Problem is infeasible.\n";
      local_1f4 = Infeasible;
    }
    else {
      (pLVar6->solution).MaxX = local_f8.MaxX;
      (pLVar6->solution).AbscissaMaxX = local_f8.AbscissaMaxX;
      (pLVar6->solution).ActiveX = local_f8.ActiveX;
      (pLVar6->solution).ActiveY = local_f8.ActiveY;
      (pLVar6->solution).MinX = local_f8.MinX;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&(pLVar6->solution).PlacedItems.m_bits,&local_f8.PlacedItems.m_bits);
      (pLVar6->solution).PlacedItems.m_num_bits = local_f8.PlacedItems.m_num_bits;
      std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator=
                ((vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)
                 &(pLVar6->solution).Items,
                 (vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)&local_f8.Items);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&(pLVar6->solution).PlacedAreaVector,&local_f8.PlacedAreaVector);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&(pLVar6->solution).DeactivatedAreaVector,&local_f8.DeactivatedAreaVector);
      *(ulong *)((long)&(pLVar6->solution).RemainingItemAreaToPlace + 2) =
           CONCAT26((undefined2)local_f8.ReducedItemInfeasiblePlacementPoints,
                    local_f8.RemainingItemAreaToPlace._2_6_);
      *(ulong *)((long)&(pLVar6->solution).ReducedItemInfeasiblePlacementPoints + 2) =
           CONCAT26(local_f8._152_2_,local_f8.ReducedItemInfeasiblePlacementPoints._2_6_);
      (pLVar6->solution).DeactivatedArea = local_f8.DeactivatedArea;
      (pLVar6->solution).RemainingItemAreaToPlace =
           (double)CONCAT62(local_f8.RemainingItemAreaToPlace._2_6_,
                            local_f8.RemainingItemAreaToPlace._0_2_);
      lVar13 = 0x19;
      pcVar15 = "Feasible solution found.\n";
      local_1f4 = Feasible;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar15,lVar13);
    std::chrono::_V2::steady_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Elapsed time until after for_each() = ",0x26);
    poVar9 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"s\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Termination delay = ",0x14);
    poVar9 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"s\n",2);
    __val = -local_1a0;
    if (0 < (long)local_1a0) {
      __val = local_1a0;
    }
    __len = 1;
    if (9 < __val) {
      uVar11 = __val;
      uVar8 = 4;
      do {
        __len = uVar8;
        if (uVar11 < 100) {
          __len = __len - 2;
          goto LAB_001465ef;
        }
        if (uVar11 < 1000) {
          __len = __len - 1;
          goto LAB_001465ef;
        }
        if (uVar11 < 10000) goto LAB_001465ef;
        bVar2 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        uVar8 = __len + 4;
      } while (bVar2);
      __len = __len + 1;
    }
LAB_001465ef:
    lVar13 = (long)local_1a0 >> 0x3f;
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_198,(ulong)(__len - (int)((long)local_1a0 >> 0x3f)),'-');
    CLI::std::__detail::__to_chars_10_impl<unsigned_long>
              (local_198._M_dataplus._M_p + -lVar13,__len,__val);
    pbVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_198,0,0,"Total explored nodes = ",0x17);
    local_1d8._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
    paVar12 = &pbVar10->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == paVar12) {
      local_1d8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    local_1d8._M_string_length = pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    pbVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_1d8,"\n");
    _local_160 = (_Optional_payload_base<int>)(pbVar10->_M_dataplus)._M_p;
    paVar12 = &pbVar10->field_2;
    if (_local_160 == (_Optional_payload_base<int>)paVar12) {
      local_150 = (SearchStatus *)paVar12->_M_allocated_capacity;
      puStack_148 = *(undefined8 **)((long)&pbVar10->field_2 + 8);
      _local_160 = (_Optional_payload_base<int>)&local_150;
    }
    else {
      local_150 = (SearchStatus *)paVar12->_M_allocated_capacity;
    }
    puStack_158 = (pointer)pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)_local_160,(long)puStack_158);
    if (_local_160 != (_Optional_payload_base<int>)&local_150) {
      operator_delete((void *)_local_160,(ulong)((long)local_150 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
  }
  SVar7 = local_1f4;
  Packing2D::~Packing2D(&local_f8);
  std::
  vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  ::~vector(&local_178);
  return SVar7;
}

Assistant:

SearchStatus LeftmostActiveOnly::SolveParallelNative()
{
    std::atomic<std::chrono::steady_clock::time_point> begin = std::chrono::steady_clock::now();
    std::atomic<std::chrono::steady_clock::time_point> endLast = begin.load();

    std::atomic<bool> feasibleSolutionCancellationToken = false;

    std::vector<std::unique_ptr<LeftmostActiveOnly>> subtrees;
    subtrees.reserve(items.size());
    ////for (size_t i = 0; i < 1; i++)
    for (size_t itemId: this->branchingOrder)
    {
        std::unique_ptr<LeftmostActiveOnly> lmao = std::make_unique<LeftmostActiveOnly>(this->parameters);
        lmao->AddContainer(container);
        lmao->AddItems(items, itemId, this->fixedItemCoordinatesX);
        lmao->SetBranchingOrder(this->branchingOrder);
        lmao->AddCancellationToken(&feasibleSolutionCancellationToken); // Optional: comment out for sequential mode.
        ////lmao->AddFixedItem(fixedItem);

        subtrees.push_back(std::move(lmao));
    }

    SearchStatus status = SearchStatus::None;

    std::atomic<size_t> exploredSubtrees(0);
    std::atomic<int64_t> exploredNodes(0);
    std::atomic<bool> isFeasible(false);
    Packing2D solution;

    std::mutex mutex;

    std::for_each(
        std::execution::par_unseq,
        subtrees.begin(),
        subtrees.end(),
        [&](std::unique_ptr<LeftmostActiveOnly>& lmao)
        {
            SearchStatus localStatus = lmao->SolveSequential();
            if (localStatus == SearchStatus::Abort)
            {
                status = localStatus;
            }

            if (localStatus == SearchStatus::Feasible)
            {
                mutex.lock();
                solution = lmao->GetSolution();
                mutex.unlock();

                isFeasible.store(true);
            }

            exploredNodes += lmao->GetTreeSize();
            exploredSubtrees++;

            std::cout << "Explored subtrees = " + std::to_string(exploredSubtrees) + " / " + std::to_string(items.size()) + "\n";

            std::chrono::steady_clock::time_point end = std::chrono::steady_clock::now();
            endLast = end;
            std::cout << "Elapsed time = " << std::chrono::duration_cast<std::chrono::seconds>(end - begin.load()).count() << "s\n";

            lmao.reset();
        });

    if (status == SearchStatus::Abort)
    {
        std::cout << "Search was aborted.\n";
        return status;
    }

    if (isFeasible.load())
    {
        this->solution = solution;
        status = SearchStatus::Feasible;
        std::cout << "Feasible solution found.\n";
    }
    else
    {
        status = SearchStatus::Infeasible;
        std::cout << "Problem is infeasible.\n";
    }

    std::chrono::steady_clock::time_point endParallelFor = std::chrono::steady_clock::now();

    std::cout << "Elapsed time until after for_each() = " << std::chrono::duration_cast<std::chrono::seconds>(endParallelFor - begin.load()).count() << "s\n";
    std::cout << "Termination delay = " << std::chrono::duration_cast<std::chrono::seconds>(endParallelFor - endLast.load()).count() << "s\n";

    std::cout << "Total explored nodes = " + std::to_string(exploredNodes.load()) + "\n";

    return status;
}